

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

CurrencyNameCacheEntry * getCacheEntry(char *locale,UErrorCode *ec)

{
  ushort uVar1;
  short sVar2;
  CurrencyNameStruct *pCVar3;
  CurrencyNameStruct *pCVar4;
  UBool UVar5;
  int iVar6;
  int32_t iVar7;
  int32_t iVar8;
  UErrorCode UVar9;
  UResourceBundle *pUVar10;
  UChar *pUVar11;
  UnicodeString *pUVar12;
  UResourceBundle *pUVar13;
  char *pcVar14;
  void *pvVar15;
  CurrencyNameCacheEntry *pCVar16;
  int8_t i_1;
  CurrencyNameCacheEntry **ppCVar17;
  long lVar18;
  int32_t iVar19;
  int indexR;
  int32_t *piVar20;
  int32_t iVar21;
  int iVar22;
  int8_t i;
  char cVar23;
  uint uVar24;
  long lVar25;
  int32_t len;
  UErrorCode ec4;
  UErrorCode ec2;
  UErrorCode ec3;
  EquivIterator iter;
  char locale_1 [157];
  char loc [157];
  int32_t local_28c;
  UErrorCode local_288;
  UErrorCode local_284;
  UResourceBundle *local_280;
  int32_t local_274;
  CurrencyNameStruct *local_270;
  UResourceBundle *local_268;
  UResourceBundle *local_260;
  ConstChar16Ptr local_258;
  CurrencyNameStruct *local_250;
  int local_244;
  char *local_240;
  UErrorCode *local_238;
  int32_t local_22c;
  UResourceBundle *local_228;
  UObject local_220;
  UResourceBundle *local_218;
  UResourceBundle *local_210;
  EquivIterator local_208;
  long local_1f0;
  int32_t *local_1e8;
  int32_t *local_1e0;
  UResourceBundle *local_1d8;
  UChar *local_1c8;
  UnicodeString local_1b8;
  UnicodeString local_178 [2];
  char local_d8 [168];
  
  umtx_lock_63(&gCurrencyCacheMutex);
  ppCVar17 = currCache;
  lVar25 = 0;
  do {
    if ((*ppCVar17 != (CurrencyNameCacheEntry *)0x0) &&
       (iVar6 = strcmp(locale,(*ppCVar17)->locale), iVar6 == 0)) goto LAB_002a9c5b;
    lVar25 = lVar25 + 1;
    ppCVar17 = ppCVar17 + 1;
  } while (lVar25 != 10);
  lVar25 = 0xff;
LAB_002a9c5b:
  cVar23 = (char)lVar25;
  if (cVar23 == -1) {
    pCVar16 = (CurrencyNameCacheEntry *)0x0;
  }
  else {
    pCVar16 = currCache[cVar23];
    pCVar16->refCount = pCVar16->refCount + 1;
  }
  umtx_unlock_63(&gCurrencyCacheMutex);
  if (cVar23 == -1) {
    local_1f0 = lVar25;
    local_220._vptr_UObject = (_func_int **)getCurrSymbolsEquiv();
    local_284 = U_ZERO_ERROR;
    local_240 = locale;
    uloc_getName_63(locale,local_d8,0x9d,&local_284);
    if (U_ZERO_ERROR < local_284 || local_284 == U_STRING_NOT_TERMINATED_WARNING) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
    local_238 = ec;
    strcpy((char *)local_178,local_d8);
    iVar6 = 0;
    local_280 = (UResourceBundle *)getCurrSymbolsEquiv();
    iVar19 = 0;
    do {
      local_288 = U_ZERO_ERROR;
      local_268 = ures_open_63("icudt63l-curr",(char *)local_178,&local_288);
      local_260 = ures_getByKey_63(local_268,"Currencies",(UResourceBundle *)0x0,&local_288);
      iVar7 = ures_getSize_63(local_260);
      if (0 < iVar7) {
        iVar6 = iVar6 + iVar7;
        iVar21 = 0;
        do {
          pUVar10 = ures_getByIndex_63(local_260,iVar21,(UResourceBundle *)0x0,&local_288);
          pUVar11 = ures_getStringByIndex_63(pUVar10,0,&local_28c,&local_288);
          if (local_280 == (UResourceBundle *)0x0) {
            iVar19 = iVar19 + 1;
          }
          else {
            local_258.p_ = pUVar11;
            icu_63::UnicodeString::UnicodeString(&local_1b8,'\x01',&local_258,local_28c);
            local_208._hash = (Hashtable *)local_280;
            local_208._start = &local_1b8;
            local_208._current = &local_1b8;
            do {
              pUVar12 = icu_63::EquivIterator::next(&local_208);
              iVar19 = iVar19 + 1;
            } while (pUVar12 != (UnicodeString *)0x0);
            icu_63::UnicodeString::~UnicodeString(&local_1b8);
            local_1c8 = local_258.p_;
          }
          iVar19 = iVar19 + 1;
          ures_close_63(pUVar10);
          iVar21 = iVar21 + 1;
        } while (iVar21 != iVar7);
      }
      local_1b8.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)((ulong)local_1b8.super_Replaceable.super_UObject._vptr_UObject &
                    0xffffffff00000000);
      pUVar10 = ures_getByKey_63(local_268,"CurrencyPlurals",(UResourceBundle *)0x0,
                                 (UErrorCode *)&local_1b8);
      iVar7 = ures_getSize_63(pUVar10);
      if (0 < iVar7) {
        iVar21 = 0;
        do {
          pUVar13 = ures_getByIndex_63(pUVar10,iVar21,(UResourceBundle *)0x0,
                                       (UErrorCode *)&local_1b8);
          iVar8 = ures_getSize_63(pUVar13);
          iVar6 = iVar6 + iVar8;
          ures_close_63(pUVar13);
          iVar21 = iVar21 + 1;
        } while (iVar7 != iVar21);
      }
      ures_close_63(pUVar10);
      ures_close_63(local_260);
      ures_close_63(local_268);
      UVar5 = fallback((char *)local_178);
    } while (UVar5 != '\0');
    local_250 = (CurrencyNameStruct *)uprv_malloc_63((long)iVar6 * 0x18);
    local_270 = (CurrencyNameStruct *)uprv_malloc_63((long)iVar19 * 0x18);
    if (*local_238 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_258.p_ = local_258.p_ & 0xffffffff00000000;
      local_288 = U_ZERO_ERROR;
      local_268 = (UResourceBundle *)
                  uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                                (UErrorCode *)&local_258);
      iVar6 = 0;
      local_260 = (UResourceBundle *)
                  uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                                &local_288);
      local_1e8 = &local_270->flag;
      local_1e0 = &local_250->flag;
      iVar19 = 0;
      iVar22 = 0;
      do {
        local_284 = U_ZERO_ERROR;
        local_228 = ures_open_63("icudt63l-curr",local_d8,&local_284);
        local_218 = ures_getByKey_63(local_228,"Currencies",(UResourceBundle *)0x0,&local_284);
        local_274 = ures_getSize_63(local_218);
        local_244 = iVar22;
        if (0 < local_274) {
          indexR = 0;
          do {
            pUVar10 = ures_getByIndex_63(local_218,indexR,(UResourceBundle *)0x0,&local_284);
            pUVar13 = (UResourceBundle *)ures_getStringByIndex_63(pUVar10,0,&local_28c,&local_284);
            pcVar14 = ures_getKey_63(pUVar10);
            if ((iVar22 == 0) ||
               (pvVar15 = uhash_get_63((UHashtable *)local_268,pcVar14), pvVar15 == (void *)0x0)) {
              local_280 = pUVar10;
              uhash_put_63((UHashtable *)local_268,pcVar14,pcVar14,(UErrorCode *)&local_258);
              iVar22 = iVar19 + 1;
              local_270[iVar19].IsoCode = pcVar14;
              local_270[iVar19].currencyName = (UChar *)pUVar13;
              local_270[iVar19].flag = 0;
              local_270[iVar19].currencyNameLen = local_28c;
              if ((Hashtable *)local_220._vptr_UObject != (Hashtable *)0x0) {
                local_208._hash = (Hashtable *)pUVar13;
                icu_63::UnicodeString::UnicodeString
                          (local_178,'\x01',(ConstChar16Ptr *)&local_208,local_28c);
                local_1d8 = (UResourceBundle *)local_208._hash;
                local_1b8.super_Replaceable.super_UObject._vptr_UObject =
                     (UObject)(UObject)local_220._vptr_UObject;
                piVar20 = local_1e8 + (long)iVar22 * 6;
                local_1b8.fUnion._0_8_ = local_178;
                local_1b8.fUnion._8_8_ = local_178;
                while (pUVar12 = icu_63::EquivIterator::next((EquivIterator *)&local_1b8),
                      pUVar12 != (UnicodeString *)0x0) {
                  ((CurrencyNameStruct *)(piVar20 + -5))->IsoCode = pcVar14;
                  uVar1 = (pUVar12->fUnion).fStackFields.fLengthAndFlags;
                  if ((uVar1 & 0x11) == 0) {
                    if ((uVar1 & 2) == 0) {
                      pUVar11 = (pUVar12->fUnion).fFields.fArray;
                    }
                    else {
                      pUVar11 = (UChar *)((long)&pUVar12->fUnion + 2);
                    }
                  }
                  else {
                    pUVar11 = (UChar *)0x0;
                  }
                  *(UChar **)(piVar20 + -3) = pUVar11;
                  *piVar20 = 0;
                  sVar2 = (pUVar12->fUnion).fStackFields.fLengthAndFlags;
                  if (sVar2 < 0) {
                    iVar19 = (pUVar12->fUnion).fFields.fLength;
                  }
                  else {
                    iVar19 = (int)sVar2 >> 5;
                  }
                  piVar20[-1] = iVar19;
                  iVar22 = iVar22 + 1;
                  piVar20 = piVar20 + 6;
                }
                icu_63::UnicodeString::~UnicodeString(local_178);
              }
              pUVar11 = ures_getStringByIndex_63(local_280,1,&local_28c,&local_284);
              pCVar4 = local_250;
              local_250[iVar6].IsoCode = pcVar14;
              pUVar11 = toUpperCase(pUVar11,local_28c,local_240);
              pCVar3 = local_270;
              pCVar4[iVar6].currencyName = pUVar11;
              pCVar4[iVar6].flag = 1;
              pCVar4[iVar6].currencyNameLen = local_28c;
              local_270[iVar22].IsoCode = pcVar14;
              pUVar11 = (UChar *)uprv_malloc_63(6);
              pCVar3[iVar22].currencyName = pUVar11;
              u_charsToUChars_63(pcVar14,pUVar11,3);
              iVar19 = iVar22 + 1;
              pCVar3 = pCVar3 + iVar22;
              pCVar3->currencyNameLen = 3;
              pCVar3->flag = 1;
              pUVar10 = local_280;
              iVar22 = local_244;
              iVar6 = iVar6 + 1;
            }
            ures_close_63(pUVar10);
            indexR = indexR + 1;
          } while (indexR != local_274);
        }
        local_178[0].super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0;
        local_210 = ures_getByKey_63(local_228,"CurrencyPlurals",(UResourceBundle *)0x0,
                                     (UErrorCode *)local_178);
        local_22c = ures_getSize_63(local_210);
        if (0 < local_22c) {
          iVar7 = 0;
          do {
            pUVar10 = ures_getByIndex_63(local_210,iVar7,(UResourceBundle *)0x0,
                                         (UErrorCode *)local_178);
            pcVar14 = ures_getKey_63(pUVar10);
            if ((iVar22 == 0) ||
               (pvVar15 = uhash_get_63((UHashtable *)local_260,pcVar14), pvVar15 == (void *)0x0)) {
              local_274 = iVar7;
              uhash_put_63((UHashtable *)local_260,pcVar14,pcVar14,&local_288);
              iVar7 = ures_getSize_63(pUVar10);
              if (0 < iVar7) {
                piVar20 = local_1e0 + (long)iVar6 * 6;
                iVar22 = 0;
                local_280 = pUVar10;
                do {
                  pUVar11 = ures_getStringByIndex_63
                                      (local_280,iVar22,(int32_t *)&local_1b8,
                                       (UErrorCode *)local_178);
                  ((CurrencyNameStruct *)(piVar20 + -5))->IsoCode = pcVar14;
                  pUVar11 = toUpperCase(pUVar11,(int32_t)local_1b8.super_Replaceable.super_UObject.
                                                         _vptr_UObject,local_240);
                  *(UChar **)(piVar20 + -3) = pUVar11;
                  *piVar20 = 1;
                  piVar20[-1] = (int32_t)local_1b8.super_Replaceable.super_UObject._vptr_UObject;
                  iVar22 = iVar22 + 1;
                  piVar20 = piVar20 + 6;
                } while (iVar7 != iVar22);
                iVar6 = iVar6 + iVar22;
                pUVar10 = local_280;
                iVar22 = local_244;
              }
              ures_close_63(pUVar10);
              iVar7 = local_274;
            }
            else {
              ures_close_63(pUVar10);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != local_22c);
        }
        ures_close_63(local_210);
        ures_close_63(local_218);
        ures_close_63(local_228);
        UVar5 = fallback(local_d8);
        iVar22 = iVar22 + 1;
      } while (UVar5 != '\0');
      uhash_close_63((UHashtable *)local_268);
      uhash_close_63((UHashtable *)local_260);
      qsort(local_250,(long)iVar6,0x18,currencyNameComparator);
      qsort(local_270,(long)iVar19,0x18,currencyNameComparator);
      UVar9 = (UErrorCode)local_258.p_;
      if ((U_ZERO_ERROR < (UErrorCode)local_258.p_) || (UVar9 = local_288, U_ZERO_ERROR < local_288)
         ) {
        *local_238 = UVar9;
      }
    }
    if (*local_238 < U_ILLEGAL_ARGUMENT_ERROR) {
      umtx_lock_63(&gCurrencyCacheMutex);
      ppCVar17 = currCache;
      lVar25 = 0;
      do {
        if ((*ppCVar17 != (CurrencyNameCacheEntry *)0x0) &&
           (iVar22 = strcmp(local_240,(*ppCVar17)->locale), lVar18 = lVar25, iVar22 == 0)) break;
        lVar25 = lVar25 + 1;
        ppCVar17 = ppCVar17 + 1;
        lVar18 = local_1f0;
      } while (lVar25 != 10);
      if ((char)lVar18 == -1) {
        pCVar16 = currCache[(byte)currentCacheEntryIndex];
        if (pCVar16 != (CurrencyNameCacheEntry *)0x0) {
          piVar20 = &pCVar16->refCount;
          *piVar20 = *piVar20 + -1;
          if (*piVar20 == 0) {
            deleteCacheEntry(pCVar16);
          }
        }
        pCVar16 = (CurrencyNameCacheEntry *)uprv_malloc_63(0xc0);
        uVar24 = (uint)(byte)currentCacheEntryIndex;
        currCache[uVar24] = pCVar16;
        strcpy((char *)pCVar16,local_240);
        pCVar16->currencyNames = local_250;
        pCVar16->totalCurrencyNameCount = iVar6;
        pCVar16->currencySymbols = local_270;
        pCVar16->totalCurrencySymbolCount = iVar19;
        pCVar16->refCount = 2;
        uVar24 = uVar24 + 1;
        currentCacheEntryIndex = (char)uVar24 + ((byte)((uVar24 & 0xff) / 5) & 0xfe) * -5;
        ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
      }
      else {
        deleteCurrencyNames(local_250,iVar6);
        deleteCurrencyNames(local_270,iVar19);
        pCVar16 = currCache[(char)lVar18];
        pCVar16->refCount = pCVar16->refCount + 1;
      }
      umtx_unlock_63(&gCurrencyCacheMutex);
    }
    else {
      pCVar16 = (CurrencyNameCacheEntry *)0x0;
    }
  }
  return pCVar16;
}

Assistant:

static CurrencyNameCacheEntry*
getCacheEntry(const char* locale, UErrorCode& ec) {

    int32_t total_currency_name_count = 0;
    CurrencyNameStruct* currencyNames = NULL;
    int32_t total_currency_symbol_count = 0;
    CurrencyNameStruct* currencySymbols = NULL;
    CurrencyNameCacheEntry* cacheEntry = NULL;

    umtx_lock(&gCurrencyCacheMutex);
    // in order to handle racing correctly,
    // not putting 'search' in a separate function.
    int8_t found = -1;
    for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
        if (currCache[i]!= NULL &&
            uprv_strcmp(locale, currCache[i]->locale) == 0) {
            found = i;
            break;
        }
    }
    if (found != -1) {
        cacheEntry = currCache[found];
        ++(cacheEntry->refCount);
    }
    umtx_unlock(&gCurrencyCacheMutex);
    if (found == -1) {
        collectCurrencyNames(locale, &currencyNames, &total_currency_name_count, &currencySymbols, &total_currency_symbol_count, ec);
        if (U_FAILURE(ec)) {
            return NULL;
        }
        umtx_lock(&gCurrencyCacheMutex);
        // check again.
        for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
            if (currCache[i]!= NULL &&
                uprv_strcmp(locale, currCache[i]->locale) == 0) {
                found = i;
                break;
            }
        }
        if (found == -1) {
            // insert new entry to 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // and remove the existing entry 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // from cache.
            cacheEntry = currCache[currentCacheEntryIndex];
            if (cacheEntry) {
                --(cacheEntry->refCount);
                // delete if the ref count is zero
                if (cacheEntry->refCount == 0) {
                    deleteCacheEntry(cacheEntry);
                }
            }
            cacheEntry = (CurrencyNameCacheEntry*)uprv_malloc(sizeof(CurrencyNameCacheEntry));
            currCache[currentCacheEntryIndex] = cacheEntry;
            uprv_strcpy(cacheEntry->locale, locale);
            cacheEntry->currencyNames = currencyNames;
            cacheEntry->totalCurrencyNameCount = total_currency_name_count;
            cacheEntry->currencySymbols = currencySymbols;
            cacheEntry->totalCurrencySymbolCount = total_currency_symbol_count;
            cacheEntry->refCount = 2; // one for cache, one for reference
            currentCacheEntryIndex = (currentCacheEntryIndex + 1) % CURRENCY_NAME_CACHE_NUM;
            ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
        } else {
            deleteCurrencyNames(currencyNames, total_currency_name_count);
            deleteCurrencyNames(currencySymbols, total_currency_symbol_count);
            cacheEntry = currCache[found];
            ++(cacheEntry->refCount);
        }
        umtx_unlock(&gCurrencyCacheMutex);
    }

    return cacheEntry;
}